

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

String * format<String,String>
                   (String *__return_storage_ptr__,String *fmtstr,String *raw_args,
                   String *raw_args_1)

{
  size_type sVar1;
  unsigned_long local_60;
  size_type local_58 [3];
  undefined1 local_40 [8];
  vector<String,_std::allocator<String>_> args;
  String *raw_args_local_1;
  String *raw_args_local;
  String *fmtstr_local;
  
  args.super__Vector_base<String,_std::allocator<String>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = raw_args_1;
  std::vector<String,_std::allocator<String>_>::vector
            ((vector<String,_std::allocator<String>_> *)local_40);
  expandFormatArguments<String,String>
            ((vector<String,_std::allocator<String>_> *)local_40,raw_args,
             args.super__Vector_base<String,_std::allocator<String>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  sVar1 = std::vector<String,_std::allocator<String>_>::size
                    ((vector<String,_std::allocator<String>_> *)local_40);
  if (sVar1 != 2) {
    local_58[0] = std::vector<String,_std::allocator<String>_>::size
                            ((vector<String,_std::allocator<String>_> *)local_40);
    local_60 = 2;
    error<unsigned_long,unsigned_long>
              ("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/format.h:200: args.size() (%1) does not equal sizeof... (raw_args) (%2)"
               ,local_58,&local_60);
  }
  formatArgs(__return_storage_ptr__,fmtstr,(vector<String,_std::allocator<String>_> *)local_40);
  std::vector<String,_std::allocator<String>_>::~vector
            ((vector<String,_std::allocator<String>_> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

String format (const String& fmtstr, const argtypes&... raw_args)
{
	std::vector<String> args;
	expandFormatArguments (args, raw_args...);
	ASSERT_EQ (args.size(), sizeof... (raw_args))
	return formatArgs (fmtstr, args);
}